

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicRectMatrix.hpp
# Opt level: O2

void __thiscall
OpenMD::DynamicRectMatrix<double>::DynamicRectMatrix
          (DynamicRectMatrix<double> *this,uint nrow,uint ncol,double *array)

{
  uint uVar1;
  uint uVar2;
  double **ppdVar3;
  long lVar4;
  ulong uVar5;
  uint j;
  ulong uVar6;
  
  allocate(this,nrow,ncol);
  uVar1 = this->nrow_;
  uVar2 = this->ncol_;
  lVar4 = 0;
  for (uVar5 = 0; uVar5 != uVar1; uVar5 = uVar5 + 1) {
    ppdVar3 = this->data_;
    for (uVar6 = 0; uVar2 != uVar6; uVar6 = uVar6 + 1) {
      ppdVar3[uVar5][uVar6] = array[(uint)((int)lVar4 + (int)uVar6)];
    }
    lVar4 = lVar4 + (ulong)uVar2;
  }
  return;
}

Assistant:

DynamicRectMatrix(unsigned int nrow, unsigned int ncol, Real* array) {
      allocate(nrow, ncol);
      for (unsigned int i = 0; i < nrow_; i++)
        for (unsigned int j = 0; j < ncol_; j++)
          this->data_[i][j] = array[i * ncol_ + j];
    }